

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrace.cpp
# Opt level: O1

string * __thiscall
booster::stack_trace::get_symbol_abi_cxx11_
          (string *__return_storage_ptr__,stack_trace *this,void *ptr)

{
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  char *__s;
  size_t sVar4;
  int status;
  Dl_info info;
  ostringstream res;
  locale lStack_1c8;
  undefined4 local_1bc;
  char *local_1b8;
  undefined8 uStack_1b0;
  char *local_1a8;
  undefined8 uStack_1a0;
  long local_190 [3];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  if (this == (stack_trace *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::locale::classic();
    std::ios::imbue(&lStack_1c8);
    std::locale::~locale(&lStack_1c8);
    poVar3 = std::ostream::_M_insert<void_const*>(local_190);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
    local_1a8 = (char *)0x0;
    uStack_1a0 = 0;
    local_1b8 = (char *)0x0;
    uStack_1b0 = 0;
    iVar2 = dladdr(this);
    if (iVar2 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"???",3);
    }
    else {
      if (local_1a8 == (char *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"???",3);
      }
      else {
        local_1bc = 0;
        __s = (char *)__cxa_demangle(local_1a8,0,0);
        pcVar1 = local_1a8;
        if (__s == (char *)0x0) {
          if (local_1a8 == (char *)0x0) {
            std::ios::clear((int)&lStack_1c8 + (int)*(undefined8 *)(local_190[0] + -0x18) + 0x38);
          }
          else {
            sVar4 = strlen(local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar1,sVar4);
          }
        }
        else {
          sVar4 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,__s,sVar4);
          free(__s);
        }
      }
      *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
           *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 8;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," + 0x",5);
      std::ostream::_M_insert<unsigned_long>((ulong)local_190);
      if (local_1b8 != (char *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," in ",4);
        pcVar1 = local_1b8;
        if (local_1b8 == (char *)0x0) {
          std::ios::clear((int)&lStack_1c8 + (int)*(undefined8 *)(local_190[0] + -0x18) + 0x38);
        }
        else {
          sVar4 = strlen(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar1,sVar4);
        }
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base(local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_symbol(void *ptr)
        {
            if(!ptr)
                return std::string();
            std::ostringstream res;
            res.imbue(std::locale::classic());
            res << ptr<<": ";
            Dl_info info = Dl_info();
            if(dladdr(ptr,&info) == 0) {
                res << "???";
            }
            else {
                if(info.dli_sname) {
                    int status = 0;
                    char *demangled = abi::__cxa_demangle(info.dli_sname,0,0,&status);
                    if(demangled) {
                        res << demangled;
                        free(demangled);
                    }
                    else {
                        res << info.dli_sname;
                    }
                }
                else {
                    res << "???";
                }

                unsigned offset = (char *)ptr - (char *)info.dli_saddr;
                res << std::hex <<" + 0x" << offset ;

                if(info.dli_fname)
                    res << " in " << info.dli_fname;
            }
           return res.str();
        }